

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForAHI(PlanningUnitMADPDiscrete *this,Index agI,Index ahI)

{
  ulong uVar1;
  ActionHistoryTree *pAVar2;
  const_reference this_00;
  const_reference pvVar3;
  Index IVar4;
  Index IVar5;
  
  if ((this->_m_params)._m_individualActionHistories == true) {
    pAVar2 = GetActionHistoryTree(this,agI,ahI);
    IVar5 = (Index)(pAVar2->_m_containedElem->super_IndividualHistory).super_History._m_length;
  }
  else {
    uVar1 = (this->super_PlanningUnit)._m_horizon;
    IVar4 = 0xffffffff;
    do {
      IVar5 = IVar4;
      IVar4 = IVar5 + 1;
      if (uVar1 <= IVar4) {
        return IVar5;
      }
      this_00 = std::
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                ::at(&this->_m_firstAHIforT,(ulong)agI);
      pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                         (this_00,(ulong)IVar4);
    } while (*pvVar3 <= (ulong)ahI);
  }
  return IVar5;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForAHI(Index agI, Index ahI) const
{
    if(_m_params.GetComputeIndividualActionHistories())
        return(GetActionHistoryTree(agI, ahI)->GetContainedElement()->
                GetLength() );

    //else... find out what time step this is a joh for
    Index t = 0;
    size_t h=GetHorizon();
    while(  t < h && _m_firstAHIforT.at(agI).at(t) <= ahI )
        t++;

    //  _m_firstJAHIforT[t] > ahI  OR t==GetHorizon
    if(t == h)
        t--; //last time step is h-1
    else
        t--;//_m_nrJointActionHistoriesT[t] > ahI so ahI belongs to 
            //previous time step.
    return(t);
}